

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

run_container_t * run_container_from_array(array_container_t *c)

{
  ushort uVar1;
  int iVar2;
  uint16_t *puVar3;
  rle16_t *prVar4;
  short sVar5;
  int32_t size;
  run_container_t *prVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint16_t uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  
  size = array_container_number_of_runs(c);
  prVar6 = run_container_create_given_capacity(size);
  uVar9 = c->cardinality;
  if (uVar9 != 0) {
    uVar8 = 0;
    uVar7 = (ulong)uVar9;
    if ((int)uVar9 < 1) {
      uVar7 = uVar8;
    }
    uVar9 = 0xfffffffe;
    uVar11 = 0xffffffff;
    while( true ) {
      uVar10 = (uint16_t)uVar11;
      sVar5 = (short)uVar9;
      if (uVar7 == uVar8) break;
      puVar3 = c->array;
      uVar1 = puVar3[uVar8];
      uVar12 = (uint)uVar1;
      uVar13 = uVar9 + 1;
      uVar9 = uVar12;
      if ((uVar13 != uVar1) &&
         (bVar14 = uVar11 != 0xffffffff, uVar11 = uVar12, uVar9 = (uint)uVar1, bVar14)) {
        prVar4 = prVar6->runs;
        iVar2 = prVar6->n_runs;
        prVar4[iVar2].value = uVar10;
        prVar4[iVar2].length = sVar5 - uVar10;
        prVar6->n_runs = iVar2 + 1;
        uVar9 = (uint)puVar3[uVar8];
      }
      uVar8 = uVar8 + 1;
    }
    prVar4 = prVar6->runs;
    iVar2 = prVar6->n_runs;
    prVar4[iVar2].value = uVar10;
    prVar4[iVar2].length = sVar5 - uVar10;
    prVar6->n_runs = iVar2 + 1;
  }
  return prVar6;
}

Assistant:

run_container_t *run_container_from_array(const array_container_t *c) {
    int32_t n_runs = array_container_number_of_runs(c);
    run_container_t *answer = run_container_create_given_capacity(n_runs);
    int prev = -2;
    int run_start = -1;
    int32_t card = c->cardinality;
    if (card == 0) return answer;
    for (int i = 0; i < card; ++i) {
        const uint16_t cur_val = c->array[i];
        if (cur_val != prev + 1) {
            // new run starts; flush old one, if any
            if (run_start != -1) add_run(answer, run_start, prev);
            run_start = cur_val;
        }
        prev = c->array[i];
    }
    // now prev is the last seen value
    add_run(answer, run_start, prev);
    // assert(run_container_cardinality(answer) == c->cardinality);
    return answer;
}